

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

ScriptBuilder * __thiscall
cfd::core::ScriptBuilder::AppendString(ScriptBuilder *this,string *message)

{
  bool bVar1;
  __type _Var2;
  int __val;
  int int_value;
  string str;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  bVar1 = ScriptOperator::IsValid(message);
  if (bVar1) {
    ScriptOperator::Get((ScriptOperator *)&str,message);
    AppendOperator(this,(ScriptOperator *)&str);
    ScriptOperator::~ScriptOperator((ScriptOperator *)&str);
    return this;
  }
  if (message->_M_string_length < 3) {
LAB_002ac67a:
    __val = atoi((message->_M_dataplus)._M_p);
    if (__val != 0) {
      ::std::__cxx11::to_string(&str,__val);
      _Var2 = ::std::operator==(&str,message);
      if (_Var2) {
        local_38._M_impl.super__Vector_impl_data._M_start = (pointer)(long)__val;
        AppendData(this,(int64_t *)&local_38);
        goto LAB_002ac6b7;
      }
      ::std::__cxx11::string::~string((string *)&str);
    }
    ByteData::ByteData((ByteData *)&str,message);
    AppendData(this,(ByteData *)&str);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&str);
  }
  else {
    ::std::__cxx11::string::substr((ulong)&str,(ulong)message);
    bVar1 = ::std::operator==(&str,"0x");
    ::std::__cxx11::string::~string((string *)&str);
    if (!bVar1) goto LAB_002ac67a;
    ::std::__cxx11::string::substr((ulong)&str,(ulong)message);
    ByteData::ByteData((ByteData *)&local_38,&str);
    AppendData(this,(ByteData *)&local_38);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
LAB_002ac6b7:
    ::std::__cxx11::string::~string((string *)&str);
  }
  return this;
}

Assistant:

ScriptBuilder& ScriptBuilder::AppendString(const std::string& message) {
  if (ScriptOperator::IsValid(message)) {
    return AppendOperator(ScriptOperator::Get(message));
  } else if ((message.length() > 2) && (message.substr(0, 2) == "0x")) {
    // to hex
    return AppendData(ByteData(message.substr(2)));
  } else {
    if (std::atoi(message.c_str()) != 0) {  // check number
      int int_value = std::atoi(message.c_str());
      std::string str = std::to_string(int_value);
      if (str == message) {
        return AppendData(static_cast<int64_t>(int_value));
      }
    }
    // hex string check (force)
    return AppendData(ByteData(message));
  }
}